

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.c
# Opt level: O0

long mk_supp(long index,supplier_t *s)

{
  int iVar1;
  long *in_RSI;
  char *in_RDI;
  long i;
  long in_stack_ffffffffffffffe8;
  
  *in_RSI = (long)in_RDI;
  sprintf((char *)(in_RSI + 1),"%s%09ld","Supplier#",in_RDI);
  iVar1 = a_rnd(index._4_4_,(int)index,s._4_4_,(char *)i);
  *(int *)((long)in_RSI + 0x3c) = iVar1;
  dss_random((long *)i,(long)in_RDI,(long)in_RSI,in_stack_ffffffffffffffe8);
  strcpy((char *)(in_RSI + 10),nations.list[in_stack_ffffffffffffffe8].text);
  strcpy((char *)((long)in_RSI + 100),
         regions.list[nations.list[in_stack_ffffffffffffffe8].weight].text);
  gen_city((char *)i,in_RDI);
  gen_phone(index,(char *)s,i);
  return 0;
}

Assistant:

long
mk_supp(long index, supplier_t *s)
{
	long i;
	/* long bad_press; */
	/* long noise; */
	/* long offset; */
	/* long type; */
        s->suppkey = index;
	sprintf(s->name, S_NAME_FMT, S_NAME_TAG, index); 
	s->alen = V_STR(S_ADDR_LEN, S_ADDR_SD, s->address);
	RANDOM(i, 0, nations.count-1, S_NTRG_SD);
	strcpy(s->nation_name,nations.list[i].text);
        strcpy(s->region_name,regions.list[nations.list[i].weight].text);
	gen_city(s->city,s->nation_name);
	gen_phone(i, s->phone, (long)C_PHNE_SD);
	return (0);
}